

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> * __thiscall
mir::inst::JumpInstruction::useVars(JumpInstruction *this)

{
  bool bVar1;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *in_RSI;
  value_type *in_RDI;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *s;
  optional<mir::inst::VarId> *in_stack_ffffffffffffffa0;
  
  std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::set
            ((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x14fb8f);
  bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x14fb9d);
  if (bVar1) {
    std::optional<mir::inst::VarId>::value(in_stack_ffffffffffffffa0);
    std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
    insert(in_RSI,in_RDI);
  }
  return (set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *)
         in_RDI;
}

Assistant:

std::set<VarId> useVars() {
    std::set<VarId> s;
    if (cond_or_ret.has_value()) {
      s.insert(cond_or_ret.value());
    }
    return s;
  }